

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::removeChildFromBranchNode
                  (BranchNode *branch,int location,uint64_t hash,int hashPos)

{
  int iVar1;
  int iVar2;
  InnerLeaf<1> *ptr;
  InnerLeaf<2> *ptr_00;
  NodePtr mergeNode;
  InnerLeaf<4> *ptr_01;
  size_t sVar3;
  size_t sVar4;
  int in_ESI;
  BranchNode *in_RDI;
  size_t leftSize;
  BranchNode *compressedBranch;
  size_t rightSize;
  size_t newSize;
  int i_5;
  InnerLeaf<4> *newLeafSize4;
  int i_4;
  InnerLeaf<3> *newLeafSize3;
  int i_3;
  InnerLeaf<2> *newLeafSize2;
  int i_2;
  InnerLeaf<1> *newLeafSize1;
  int i_1;
  int i;
  int childEntries;
  int newNumChild;
  NodePtr newNode;
  InnerLeaf<4> *in_stack_fffffffffffffed0;
  NodePtr *in_stack_fffffffffffffee8;
  NodePtr local_f0;
  BranchNode *local_e8;
  NodePtr local_e0;
  size_t local_d8;
  ulong local_d0;
  uintptr_t local_c8;
  int local_bc;
  NodePtr local_b8;
  InnerLeaf<4> *local_b0;
  uintptr_t local_a8;
  int in_stack_ffffffffffffff64;
  NodePtr in_stack_ffffffffffffff68;
  NodePtr in_stack_ffffffffffffff70;
  int local_7c;
  NodePtr local_78;
  InnerLeaf<2> *local_70;
  uintptr_t local_68;
  int local_5c;
  NodePtr local_58 [3];
  InnerLeaf<1> *local_40;
  int local_34;
  int local_30;
  uint local_2c;
  int local_28;
  int local_14;
  BranchNode *local_10;
  NodePtr local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  NodePtr::NodePtr(&local_8);
  iVar1 = Occupation::num_set((Occupation *)0x5ffd5f);
  local_28 = iVar1;
  iVar2 = InnerLeaf<1>::capacity();
  if (iVar1 * iVar2 < 0x37) {
    local_2c = 0;
    for (local_30 = 0; local_30 <= local_28; local_30 = local_30 + 1) {
      iVar1 = NodePtr::numEntriesEstimate(in_stack_fffffffffffffee8);
      local_2c = iVar1 + local_2c;
      if (0x36 < (int)local_2c) break;
    }
    if ((int)local_2c < 0x36) {
      local_2c = 0;
      for (local_34 = 0; local_34 <= local_28; local_34 = local_34 + 1) {
        iVar1 = NodePtr::numEntries(in_stack_fffffffffffffee8);
        local_2c = iVar1 + local_2c;
      }
      if ((int)local_2c < 0x36) {
        iVar1 = entries_to_size_class(local_2c);
        switch(iVar1) {
        case 1:
          ptr = (InnerLeaf<1> *)operator_new(0xd8);
          InnerLeaf<1>::InnerLeaf((InnerLeaf<1> *)in_stack_fffffffffffffed0);
          local_40 = ptr;
          NodePtr::NodePtr(local_58,ptr);
          local_8.ptrAndType = local_58[0].ptrAndType;
          for (local_5c = 0; local_5c <= local_28; local_5c = local_5c + 1) {
            local_68 = local_10->child[local_5c].ptrAndType;
            mergeIntoLeaf<1>((InnerLeaf<1> *)in_stack_ffffffffffffff68.ptrAndType,
                             in_stack_ffffffffffffff64,in_stack_ffffffffffffff70);
          }
          break;
        case 2:
          ptr_00 = (InnerLeaf<2> *)operator_new(0x2d8);
          InnerLeaf<2>::InnerLeaf((InnerLeaf<2> *)in_stack_fffffffffffffed0);
          local_70 = ptr_00;
          NodePtr::NodePtr(&local_78,ptr_00);
          local_8.ptrAndType = local_78.ptrAndType;
          for (local_7c = 0; local_7c <= local_28; local_7c = local_7c + 1) {
            mergeIntoLeaf<2>((InnerLeaf<2> *)in_stack_ffffffffffffff68.ptrAndType,
                             in_stack_ffffffffffffff64,in_stack_ffffffffffffff70);
          }
          break;
        case 3:
          mergeNode.ptrAndType = (uintptr_t)operator_new(0x4d8);
          InnerLeaf<3>::InnerLeaf((InnerLeaf<3> *)in_stack_fffffffffffffed0);
          NodePtr::NodePtr((NodePtr *)&stack0xffffffffffffff68,(InnerLeaf<3> *)mergeNode.ptrAndType)
          ;
          local_8.ptrAndType = in_stack_ffffffffffffff68.ptrAndType;
          for (iVar1 = 0; iVar1 <= local_28; iVar1 = iVar1 + 1) {
            local_a8 = local_10->child[iVar1].ptrAndType;
            mergeIntoLeaf<3>((InnerLeaf<3> *)in_stack_ffffffffffffff68.ptrAndType,iVar1,mergeNode);
          }
          break;
        case 4:
          ptr_01 = (InnerLeaf<4> *)operator_new(0x6d8);
          InnerLeaf<4>::InnerLeaf(in_stack_fffffffffffffed0);
          local_b0 = ptr_01;
          NodePtr::NodePtr(&local_b8,ptr_01);
          local_8.ptrAndType = local_b8.ptrAndType;
          for (local_bc = 0; local_bc <= local_28; local_bc = local_bc + 1) {
            local_c8 = local_10->child[local_bc].ptrAndType;
            mergeIntoLeaf<4>((InnerLeaf<4> *)in_stack_ffffffffffffff68.ptrAndType,
                             in_stack_ffffffffffffff64,in_stack_ffffffffffffff70);
          }
        }
        destroyBranchingNode((void *)0x60021e);
        return (NodePtr)local_8.ptrAndType;
      }
    }
  }
  sVar3 = getBranchNodeSize(local_28);
  local_d8 = (long)(local_28 - local_14) << 3;
  local_d0 = sVar3;
  sVar4 = getBranchNodeSize(local_28 + 1);
  if (sVar3 == sVar4) {
    memmove(local_10->child + local_14,local_10->child + (local_14 + 1),local_d8);
    NodePtr::NodePtr(&local_e0,local_10);
    local_8.ptrAndType = local_e0.ptrAndType;
  }
  else {
    local_e8 = (BranchNode *)operator_new(local_d0);
    NodePtr::NodePtr(&local_f0,local_e8);
    local_8.ptrAndType = local_f0.ptrAndType;
    memcpy(local_e8,local_10,(long)local_14 * 8 + 8);
    memcpy(local_e8->child + local_14,local_10->child + (local_14 + 1),local_d8);
    destroyBranchingNode((void *)0x600384);
  }
  return (NodePtr)local_8.ptrAndType;
}

Assistant:

static NodePtr removeChildFromBranchNode(BranchNode* branch, int location,
                                           uint64_t hash, int hashPos) {
    NodePtr newNode;
    int newNumChild = branch->occupation.num_set();

    // first check if we might be able to merge all children into one new leaf
    // based on the node numbers and assuming all of them might be in the
    // smallest size class
    if (newNumChild * InnerLeaf<1>::capacity() <= kLeafBurstThreshold) {
      // since we have a good chance of merging we now check the actual size
      // classes to see if that yields a number of entries at most the burst
      // threshold
      int childEntries = 0;
      for (int i = 0; i <= newNumChild; ++i) {
        childEntries += branch->child[i].numEntriesEstimate();
        if (childEntries > kLeafBurstThreshold) break;
      }

      if (childEntries < kLeafBurstThreshold) {
        // create a new merged inner leaf node containing all entries of
        // children first recompute the number of entries, but this time access
        // each child to get the actual number of entries needed and determine
        // this nodes size class since before we estimated the number of child
        // entries from the capacities of our child leaf node types which are
        // stored in the branch nodes pointers directly and avoid unnecessary
        // accesses of nodes that are not in cache.
        childEntries = 0;
        for (int i = 0; i <= newNumChild; ++i)
          childEntries += branch->child[i].numEntries();

        // check again if we exceed due to the extremely unlikely case
        // of having less than 5 list nodes with together more than 30 entries
        // as list nodes are only created in the last depth level
        if (childEntries < kLeafBurstThreshold) {
          switch (entries_to_size_class(childEntries)) {
            case 1: {
              InnerLeaf<1>* newLeafSize1 = new InnerLeaf<1>;
              newNode = newLeafSize1;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize1, hashPos, branch->child[i]);
              break;
            }
            case 2: {
              InnerLeaf<2>* newLeafSize2 = new InnerLeaf<2>;
              newNode = newLeafSize2;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize2, hashPos, branch->child[i]);
              break;
            }
            case 3: {
              InnerLeaf<3>* newLeafSize3 = new InnerLeaf<3>;
              newNode = newLeafSize3;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize3, hashPos, branch->child[i]);
              break;
            }
            case 4: {
              InnerLeaf<4>* newLeafSize4 = new InnerLeaf<4>;
              newNode = newLeafSize4;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize4, hashPos, branch->child[i]);
              break;
            }
            default:
              // Unexpected result from 'entries_to_size_class'
              assert(false);
          }

          destroyBranchingNode(branch);
          return newNode;
        }
      }
    }

    size_t newSize = getBranchNodeSize(newNumChild);
    size_t rightSize = (newNumChild - location) * sizeof(NodePtr);
    if (newSize == getBranchNodeSize(newNumChild + 1)) {
      // allocated size class is the same, so we do not allocate a new node
      memmove(&branch->child[location], &branch->child[location + 1],
              rightSize);
      newNode = branch;
    } else {
      // allocated size class changed, so we allocate a smaller branch node
      BranchNode* compressedBranch = (BranchNode*)::operator new(newSize);
      newNode = compressedBranch;

      size_t leftSize =
          offsetof(BranchNode, child) + location * sizeof(NodePtr);
      memcpy(compressedBranch, branch, leftSize);
      memcpy(&compressedBranch->child[location], &branch->child[location + 1],
             rightSize);

      destroyBranchingNode(branch);
    }

    return newNode;
  }